

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

size_t Curl_multissl_version(char *buffer,size_t size)

{
  Curl_ssl *pCVar1;
  size_t sVar2;
  Curl_ssl *pCVar3;
  long lVar4;
  size_t sVar5;
  
  pCVar3 = Curl_ssl;
  if (Curl_ssl == &Curl_ssl_multi) {
    pCVar3 = available_backends[0];
  }
  if (pCVar3 != Curl_multissl_version::selected) {
    Curl_multissl_version::selected = pCVar3;
    if (available_backends[0] == (Curl_ssl *)0x0) {
      sVar5 = 0;
    }
    else {
      lVar4 = 0;
      sVar5 = 0;
      pCVar1 = available_backends[0];
      do {
        if (lVar4 != 0) {
          Curl_multissl_version::backends[sVar5] = ' ';
          sVar5 = sVar5 + 1;
        }
        if (pCVar3 != pCVar1) {
          Curl_multissl_version::backends[sVar5] = '(';
          sVar5 = sVar5 + 1;
        }
        sVar2 = (*pCVar1->version)(Curl_multissl_version::backends + sVar5,0xc6 - sVar5);
        pCVar3 = Curl_multissl_version::selected;
        sVar5 = sVar2 + sVar5;
        if (Curl_multissl_version::selected != available_backends[lVar4]) {
          Curl_multissl_version::backends[sVar5] = ')';
          sVar5 = sVar5 + 1;
        }
        pCVar1 = available_backends[lVar4 + 1];
      } while ((pCVar1 != (Curl_ssl *)0x0) && (lVar4 = lVar4 + 1, (long)sVar5 < 0xc4));
    }
    Curl_multissl_version::backends[sVar5] = '\0';
    Curl_multissl_version::total = sVar5;
  }
  sVar5 = Curl_multissl_version::total;
  if (Curl_multissl_version::total < size) {
    memcpy(buffer,Curl_multissl_version::backends,Curl_multissl_version::total + 1);
  }
  else {
    memcpy(buffer,Curl_multissl_version::backends,size - 1);
    buffer[size - 1] = '\0';
  }
  if (size - 1 < sVar5) {
    sVar5 = size - 1;
  }
  return sVar5;
}

Assistant:

static size_t Curl_multissl_version(char *buffer, size_t size)
{
  static const struct Curl_ssl *selected;
  static char backends[200];
  static size_t total;
  const struct Curl_ssl *current;

  current = Curl_ssl == &Curl_ssl_multi ? available_backends[0] : Curl_ssl;

  if(current != selected) {
    char *p = backends;
    char *end = backends + sizeof(backends);
    int i;

    selected = current;

    for(i = 0; available_backends[i] && p < (end - 4); i++) {
      if(i)
        *(p++) = ' ';
      if(selected != available_backends[i])
        *(p++) = '(';
      p += available_backends[i]->version(p, end - p - 2);
      if(selected != available_backends[i])
        *(p++) = ')';
    }
    *p = '\0';
    total = p - backends;
  }

  if(size > total)
    memcpy(buffer, backends, total + 1);
  else {
    memcpy(buffer, backends, size - 1);
    buffer[size - 1] = '\0';
  }

  return CURLMIN(size - 1, total);
}